

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::debugReportRowPrice
          (HighsSparseMatrix *this,HighsInt iRow,double multiplier,HighsInt to_iEl,
          vector<double,_std::allocator<double>_> *result)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  
  if ((this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iRow] < to_iEl) {
    printf("Row %d: value = %11.4g",(ulong)(uint)iRow);
    lVar3 = (long)(this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iRow];
    iVar2 = 0;
    uVar4 = 0;
    while( true ) {
      if (to_iEl <= lVar3) break;
      uVar1 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      dVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] * multiplier +
              (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[(int)uVar1];
      uVar5 = -(ulong)(ABS(dVar6) < 1e-14);
      if ((uVar4 / 5) * 5 + iVar2 == 0) {
        putchar(10);
      }
      printf("[%4d %11.4g] ",uVar5 & 0x358dee7a4ad4b81f | ~uVar5 & (ulong)dVar6,(ulong)uVar1);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 1;
      iVar2 = iVar2 + -1;
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void HighsSparseMatrix::debugReportRowPrice(
    const HighsInt iRow, const double multiplier, const HighsInt to_iEl,
    const vector<double>& result) const {
  if (this->start_[iRow] >= to_iEl) return;
  printf("Row %d: value = %11.4g", (int)iRow, multiplier);
  HighsInt num_print = 0;
  for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
    HighsInt iCol = this->index_[iEl];
    double value0 = result[iCol];
    double value1 = value0 + multiplier * this->value_[iEl];
    double value2 = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    if (num_print % 5 == 0) printf("\n");
    printf("[%4d %11.4g] ", (int)(iCol), value2);
    num_print++;
  }
  printf("\n");
}